

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

int nni_http_set_version(nng_http *conn,char *vers)

{
  char *__s2;
  int iVar1;
  long lVar2;
  char *__s1;
  
  __s1 = "HTTP/1.1";
  if (vers != (char *)0x0) {
    __s1 = vers;
  }
  lVar2 = 0;
  do {
    if (lVar2 == 0x28) {
      return 9;
    }
    __s2 = *(char **)((long)nni_http_set_version::http_versions + lVar2);
    iVar1 = strcmp(__s1,__s2);
    lVar2 = lVar2 + 8;
  } while (iVar1 != 0);
  conn->vers = __s2;
  return 0;
}

Assistant:

int
nni_http_set_version(nng_http *conn, const char *vers)
{
	static const char *http_versions[] = {
		// for efficiency, we order in most likely first
		"HTTP/1.1",
		"HTTP/2",
		"HTTP/3",
		"HTTP/1.0",
		"HTTP/0.9",
		NULL,
	};

	vers = vers != NULL ? vers : NNG_HTTP_VERSION_1_1;
	for (int i = 0; http_versions[i] != NULL; i++) {
		if (strcmp(vers, http_versions[i]) == 0) {
			conn->vers = http_versions[i];
			return (NNG_OK);
		}
	}
	return (NNG_ENOTSUP);
}